

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O0

void __thiscall
Assimp::SplitByBoneCountProcess::Execute(SplitByBoneCountProcess *this,aiScene *pScene)

{
  pointer ppaVar1;
  bool bVar2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  reference __x;
  aiMesh **ppaVar9;
  size_type local_3d0;
  size_type local_3c8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_248;
  aiMesh **local_228;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_220;
  value_type_conflict1 local_214;
  value_type_conflict1 local_210;
  uint local_20c;
  undefined1 local_208 [4];
  uint b;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> newMeshes;
  aiMesh *srcMesh;
  undefined1 local_1e0 [4];
  uint a_1;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  uint local_20;
  char local_19;
  uint a;
  bool isNecessary;
  aiScene *pScene_local;
  SplitByBoneCountProcess *this_local;
  
  _a = pScene;
  pScene_local = (aiScene *)this;
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"SplitByBoneCountProcess begin");
  local_19 = '\0';
  for (local_20 = 0; local_20 < _a->mNumMeshes; local_20 = local_20 + 1) {
    if (this->mMaxBoneCount < (ulong)_a->mMeshes[local_20]->mNumBones) {
      local_19 = '\x01';
    }
  }
  if (local_19 == '\0') {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_1b8);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1b8,
                        (char (*) [61])
                        "SplitByBoneCountProcess early-out: no meshes with more than ");
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,&this->mMaxBoneCount);
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,(char (*) [8])" bones.");
    Formatter::basic_formatter::operator_cast_to_string(&local_40,pbVar5);
    Logger::debug(pLVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1b8);
  }
  else {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::clear(&this->mSubMeshIndices);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&this->mSubMeshIndices,(ulong)_a->mNumMeshes);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
    for (srcMesh._4_4_ = 0; srcMesh._4_4_ < _a->mNumMeshes; srcMesh._4_4_ = srcMesh._4_4_ + 1) {
      newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)_a->mMeshes[srcMesh._4_4_];
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_208);
      SplitMesh(this,_a->mMeshes[srcMesh._4_4_],
                (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_208);
      bVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_208);
      if (bVar2) {
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&this->mSubMeshIndices,(ulong)srcMesh._4_4_);
        sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
        local_214 = (value_type_conflict1)sVar7;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar8,&local_214);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0,
                   (value_type *)
                   &newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        for (local_20c = 0; uVar6 = (ulong)local_20c,
            sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_208),
            ppaVar1 = newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage, uVar6 < sVar7;
            local_20c = local_20c + 1) {
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](&this->mSubMeshIndices,(ulong)srcMesh._4_4_);
          sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
          local_210 = (value_type_conflict1)sVar7;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar8,&local_210);
          __x = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_208,(ulong)local_20c
                          );
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0,__x);
        }
        if (newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          aiMesh::~aiMesh((aiMesh *)
                          newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
          operator_delete(ppaVar1);
        }
      }
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_208);
    }
    sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
    _a->mNumMeshes = (uint)sVar7;
    if (_a->mMeshes != (aiMesh **)0x0) {
      operator_delete__(_a->mMeshes);
    }
    ppaVar9 = (aiMesh **)operator_new__((ulong)_a->mNumMeshes << 3);
    _a->mMeshes = ppaVar9;
    local_220._M_current =
         (aiMesh **)
         std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                   ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
    local_228 = (aiMesh **)
                std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              (local_220,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               local_228,_a->mMeshes);
    UpdateNode(this,_a->mRootNode);
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_3c0);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_3c0,(char (*) [36])"SplitByBoneCountProcess end: split ");
    local_3c8 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::size(&this->mSubMeshIndices);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,&local_3c8);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,(char (*) [14])" meshes into ");
    local_3d0 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,&local_3d0);
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,(char (*) [12])" submeshes.");
    Formatter::basic_formatter::operator_cast_to_string(&local_248,pbVar5);
    Logger::debug(pLVar3,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_3c0);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1e0);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("SplitByBoneCountProcess begin");

    // early out
    bool isNecessary = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
        if( pScene->mMeshes[a]->mNumBones > mMaxBoneCount )
            isNecessary = true;

    if( !isNecessary )
    {
        ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess early-out: no meshes with more than " << mMaxBoneCount << " bones." );
        return;
    }

    // we need to do something. Let's go.
    mSubMeshIndices.clear();
    mSubMeshIndices.resize( pScene->mNumMeshes);

    // build a new array of meshes for the scene
    std::vector<aiMesh*> meshes;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
    {
        aiMesh* srcMesh = pScene->mMeshes[a];

        std::vector<aiMesh*> newMeshes;
        SplitMesh( pScene->mMeshes[a], newMeshes);

        // mesh was split
        if( !newMeshes.empty() )
        {
            // store new meshes and indices of the new meshes
            for( unsigned int b = 0; b < newMeshes.size(); ++b)
            {
                mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
                meshes.push_back( newMeshes[b]);
            }

            // and destroy the source mesh. It should be completely contained inside the new submeshes
            delete srcMesh;
        }
        else
        {
            // Mesh is kept unchanged - store it's new place in the mesh array
            mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
            meshes.push_back( srcMesh);
        }
    }

    // rebuild the scene's mesh array
    pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    delete [] pScene->mMeshes;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

    // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
    UpdateNode( pScene->mRootNode);

    ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess end: split " << mSubMeshIndices.size() << " meshes into " << meshes.size() << " submeshes." );
}